

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

void __thiscall perfetto::base::Subprocess::Subprocess(Subprocess *this,Subprocess *other)

{
  MovableState *this_00;
  
  Args::Args(&this->args,
             (initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )ZEXT816(0));
  (this->s_)._M_t.
  super___uniq_ptr_impl<perfetto::base::Subprocess::MovableState,_std::default_delete<perfetto::base::Subprocess::MovableState>_>
  ._M_t.
  super__Tuple_impl<0UL,_perfetto::base::Subprocess::MovableState_*,_std::default_delete<perfetto::base::Subprocess::MovableState>_>
  .super__Head_base<0UL,_perfetto::base::Subprocess::MovableState_*,_false>._M_head_impl =
       (MovableState *)0x0;
  std::
  __uniq_ptr_impl<perfetto::base::Subprocess::MovableState,_std::default_delete<perfetto::base::Subprocess::MovableState>_>
  ::operator=((__uniq_ptr_impl<perfetto::base::Subprocess::MovableState,_std::default_delete<perfetto::base::Subprocess::MovableState>_>
               *)&this->s_,
              (__uniq_ptr_impl<perfetto::base::Subprocess::MovableState,_std::default_delete<perfetto::base::Subprocess::MovableState>_>
               *)&other->s_);
  Args::operator=(&this->args,&other->args);
  this_00 = (MovableState *)operator_new(0x68);
  *(undefined8 *)&(this_00->exit_status_pipe).wr = 0;
  this_00->input_written = 0;
  (this_00->rusage)._M_t.
  super___uniq_ptr_impl<perfetto::base::Subprocess::ResourceUsage,_std::default_delete<perfetto::base::Subprocess::ResourceUsage>_>
  ._M_t.
  super__Tuple_impl<0UL,_perfetto::base::Subprocess::ResourceUsage_*,_std::default_delete<perfetto::base::Subprocess::ResourceUsage>_>
  .super__Head_base<0UL,_perfetto::base::Subprocess::ResourceUsage_*,_false>._M_head_impl =
       (ResourceUsage *)0x0;
  this_00->timed_out = false;
  *(undefined3 *)&this_00->field_0x49 = 0;
  (this_00->exit_status_pipe).rd = 0;
  (this_00->output).field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&(this_00->output).field_2 + 8) = 0;
  (this_00->output)._M_dataplus._M_p = (pointer)0x0;
  (this_00->output)._M_string_length = 0;
  this_00->pid = 0;
  this_00->status = kNotStarted;
  *(undefined8 *)&this_00->returncode = 0;
  (this_00->stdin_pipe).rd = 0;
  (this_00->stdin_pipe).wr = 0;
  (this_00->stdouterr_pipe).rd = 0;
  (this_00->stdouterr_pipe).wr = 0;
  (this_00->waitpid_thread)._M_id._M_thread = 0;
  MovableState::MovableState(this_00);
  std::
  __uniq_ptr_impl<perfetto::base::Subprocess::MovableState,_std::default_delete<perfetto::base::Subprocess::MovableState>_>
  ::reset((__uniq_ptr_impl<perfetto::base::Subprocess::MovableState,_std::default_delete<perfetto::base::Subprocess::MovableState>_>
           *)&other->s_,this_00);
  ~Subprocess(other);
  Subprocess(other,(initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    )ZEXT816(0));
  return;
}

Assistant:

Subprocess::Subprocess(Subprocess&& other) noexcept {
  static_assert(sizeof(Subprocess) ==
                    sizeof(std::tuple<std::unique_ptr<MovableState>, Args>),
                "base::Subprocess' move ctor needs updating");
  s_ = std::move(other.s_);
  args = std::move(other.args);

  // Reset the state of the moved-from object.
  other.s_.reset(new MovableState());
  other.~Subprocess();
  new (&other) Subprocess();
}